

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O0

RpcValue __thiscall
miniros::master::Master::getSystemState(Master *this,string *caller_id,Connection *connection)

{
  bool bVar1;
  XmlRpcValue *rhs;
  XmlRpcSource *in_RCX;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  undefined8 in_RDI;
  RpcValue RVar2;
  RpcValue listoftypes;
  SystemState state;
  bool enabled;
  RequesterInfo requesterInfo;
  anon_class_1_0_00000001 writeXml;
  RpcValue *res;
  undefined8 in_stack_fffffffffffffda8;
  Level level;
  RequesterInfo *in_stack_fffffffffffffdb0;
  RequesterInfo *in_stack_fffffffffffffdb8;
  LogLocation *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  int size;
  RequesterInfo *in_stack_fffffffffffffdd0;
  Level LVar3;
  string *in_stack_fffffffffffffdd8;
  LogLocation *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  XmlRpcValue *in_stack_fffffffffffffe10;
  RpcValue *in_stack_fffffffffffffe70;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *in_stack_fffffffffffffe78;
  anon_class_1_0_00000001 *in_stack_fffffffffffffe80;
  allocator<char> local_111;
  string local_110 [16];
  RequesterInfo *in_stack_ffffffffffffff00;
  MasterHandler *in_stack_ffffffffffffff08;
  Error local_ec [17];
  
  level = (Level)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  size = (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
  XmlRpc::XmlRpcValue::Array(size);
  XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffdb0,level);
  XmlRpc::XmlRpcValue::operator=
            ((XmlRpcValue *)in_stack_fffffffffffffde0,(int *)in_stack_fffffffffffffdd8);
  XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffdb0,level);
  XmlRpc::XmlRpcValue::operator=
            (in_stack_fffffffffffffe10,
             (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  RequesterInfo::RequesterInfo(in_stack_fffffffffffffdd0);
  LVar3 = (Level)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
  XmlRpc::XmlRpcSource::getfd(in_RCX);
  local_ec[0] = RequesterInfo::assign
                          (in_stack_fffffffffffffdb8,&in_stack_fffffffffffffdb0->callerId,level);
  bVar1 = Error::operator_cast_to_bool(local_ec);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((getSystemState::loc.initialized_ ^ 0xffU) & 1) != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                 (allocator<char> *)in_stack_fffffffffffffde0);
      console::initializeLogLocation(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,LVar3);
      ::std::__cxx11::string::~string(local_110);
      ::std::allocator<char>::~allocator(&local_111);
    }
    if (getSystemState::loc.level_ != Warn) {
      console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffffdb0,level);
      console::checkLogLocationEnabled(in_stack_fffffffffffffdc0);
    }
    LVar3 = getSystemState::loc.level_;
    if ((getSystemState::loc.logger_enabled_ & 1U) != 0) {
      in_stack_fffffffffffffdf0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           getSystemState::loc.logger_;
      in_stack_fffffffffffffdb0 = (RequesterInfo *)::std::__cxx11::string::c_str();
      level = Debug;
      console::print((FilterBase *)0x0,in_stack_fffffffffffffdf0,(Level)(ulong)LVar3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/master.cpp"
                     ,0xd8,
                     "Master::RpcValue miniros::master::Master::getSystemState(const std::string &, Connection *)"
                    );
    }
  }
  MasterHandler::getSystemState(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  XmlRpc::XmlRpcValue::Array(size);
  rhs = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffdb0,level);
  getSystemState::anon_class_1_0_00000001::operator()
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffdb0,level);
  getSystemState::anon_class_1_0_00000001::operator()
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffdb0,level);
  getSystemState::anon_class_1_0_00000001::operator()
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffdb0,level);
  XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)in_stack_fffffffffffffdf0,rhs);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x52a7a4);
  MasterHandler::SystemState::~SystemState((SystemState *)in_stack_fffffffffffffdb0);
  RequesterInfo::~RequesterInfo(in_stack_fffffffffffffdb0);
  RVar2._value.asDouble = extraout_RDX.asDouble;
  RVar2._0_8_ = in_RDI;
  return RVar2;
}

Assistant:

Master::RpcValue Master::getSystemState(const std::string& caller_id, Connection* connection)
{
  RpcValue res = RpcValue::Array(3);
  res[0] = 1;
  res[1] = "current system state";

  auto writeXml = [&](const std::map<std::string, std::vector<std::string>>& providers, RpcValue& result) {
    int index = 0;
    result.setSize(providers.size());
    for (const auto& [key, apis] : providers) {
      RpcValue xmlApis;
      xmlApis.setSize(apis.size());
      for (size_t i = 0; i < apis.size(); i++) {
        xmlApis[i] = apis[i];
      }

      RpcValue group;
      group.setSize(2);
      group[0] = key;
      group[1] = xmlApis;
      result[index++] = group;
    }
  };

  RequesterInfo requesterInfo;
  if (!requesterInfo.assign(caller_id, connection->getfd())) {
    MINIROS_WARN("Failed to read network address of caller %s", caller_id.c_str());
  }

  MasterHandler::SystemState state = m_handler.getSystemState(requesterInfo);

  RpcValue listoftypes = RpcValue::Array(3);

  writeXml(state.publishers, listoftypes[0]);
  writeXml(state.subscribers, listoftypes[1]);
  writeXml(state.services, listoftypes[2]);

  res[2] = listoftypes;
  return res;
}